

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall dd::ProcessThreadImpl::ProcessThreadImpl(ProcessThreadImpl *this,char *thread_name)

{
  char *thread_name_local;
  ProcessThreadImpl *this_local;
  
  ProcessThread::ProcessThread(&this->super_ProcessThread);
  (this->super_ProcessThread).super_TaskQueueBase._vptr_TaskQueueBase =
       (_func_int **)&PTR_Delete_001c0a78;
  Lock::Lock(&this->_lock);
  ThreadChecker::ThreadChecker(&this->_thread_checker);
  Event::Event(&this->_wake_up);
  std::unique_ptr<dd::PlatformThread,std::default_delete<dd::PlatformThread>>::
  unique_ptr<std::default_delete<dd::PlatformThread>,void>
            ((unique_ptr<dd::PlatformThread,std::default_delete<dd::PlatformThread>> *)
             &this->_thread);
  std::__cxx11::
  list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ::list(&this->_modules);
  std::queue<dd::QueuedTask*,std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>>::
  queue<std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>,void>
            ((queue<dd::QueuedTask*,std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>> *)
             &this->_queue);
  std::
  priority_queue<dd::ProcessThreadImpl::DelayedTask,std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,std::less<dd::ProcessThreadImpl::DelayedTask>>
  ::
  priority_queue<std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,void>
            ((priority_queue<dd::ProcessThreadImpl::DelayedTask,std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,std::less<dd::ProcessThreadImpl::DelayedTask>>
              *)&this->_delayed_tasks);
  this->_stop = false;
  this->_thread_name = thread_name;
  return;
}

Assistant:

ProcessThreadImpl::ProcessThreadImpl(const char* thread_name)
		: _stop(false), _thread_name(thread_name) {}